

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O2

unique_ptr<S2Shape,_std::default_delete<S2Shape>_> __thiscall
s2shapeutil::TaggedShapeFactory::operator[](TaggedShapeFactory *this,int shape_id)

{
  bool bVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  TypeTag tag;
  Decoder decoder;
  uint local_34;
  Decoder local_30;
  
  s2coding::EncodedStringVector::GetDecoder
            (&local_30,(EncodedStringVector *)(CONCAT44(in_register_00000034,shape_id) + 0x28),
             in_EDX);
  bVar1 = Decoder::get_varint32(&local_30,&local_34);
  if (bVar1) {
    std::function<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*)>
    ::operator()((function<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*)>
                  *)this,shape_id + 8,(Decoder *)(ulong)local_34);
  }
  else {
    (this->super_ShapeFactory)._vptr_ShapeFactory = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)
         (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)this;
}

Assistant:

unique_ptr<S2Shape> TaggedShapeFactory::operator[](int shape_id) const {
  Decoder decoder = encoded_shapes_.GetDecoder(shape_id);
  S2Shape::TypeTag tag;
  if (!decoder.get_varint32(&tag)) return nullptr;
  return shape_decoder_(tag, &decoder);
}